

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

void __thiscall spvtools::opt::UpgradeMemoryModel::UpgradeMemoryScope(UpgradeMemoryModel *this)

{
  Module *this_00;
  anon_class_8_1_8991fb9c local_38;
  function<void_(spvtools::opt::Instruction_*)> local_30;
  UpgradeMemoryModel *local_10;
  UpgradeMemoryModel *this_local;
  
  local_10 = this;
  this_00 = Pass::get_module(&this->super_Pass);
  local_38.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::UpgradeMemoryModel::UpgradeMemoryScope()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_30,&local_38);
  Module::ForEachInst(this_00,&local_30,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_30);
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeMemoryScope() {
  get_module()->ForEachInst([this](Instruction* inst) {
    // Don't need to handle all the operations that take a scope.
    // * Group operations can only be subgroup
    // * Non-uniform can only be workgroup or subgroup
    // * Named barriers are not supported by Vulkan
    // * Workgroup ops (e.g. async_copy) have at most workgroup scope.
    if (spvOpcodeIsAtomicOp(inst->opcode())) {
      if (IsDeviceScope(inst->GetSingleWordInOperand(1))) {
        inst->SetInOperand(1, {GetScopeConstant(spv::Scope::QueueFamilyKHR)});
      }
    } else if (inst->opcode() == spv::Op::OpControlBarrier) {
      if (IsDeviceScope(inst->GetSingleWordInOperand(1))) {
        inst->SetInOperand(1, {GetScopeConstant(spv::Scope::QueueFamilyKHR)});
      }
    } else if (inst->opcode() == spv::Op::OpMemoryBarrier) {
      if (IsDeviceScope(inst->GetSingleWordInOperand(0))) {
        inst->SetInOperand(0, {GetScopeConstant(spv::Scope::QueueFamilyKHR)});
      }
    }
  });
}